

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O3

FT_Error FT_Stream_ReadFields(FT_Stream stream,FT_Frame_Field *fields,void *structure)

{
  uchar **ppuVar1;
  byte bVar2;
  FT_Byte FVar3;
  bool bVar4;
  FT_Error FVar5;
  ulong uVar6;
  sbyte sVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  uint *__src;
  uint *puVar11;
  FT_UShort *pFVar12;
  
  if (fields == (FT_Frame_Field *)0x0) {
    FVar5 = 6;
  }
  else {
    if (stream != (FT_Stream)0x0) {
      ppuVar1 = &stream->cursor;
      __src = (uint *)stream->cursor;
      pFVar12 = &fields->offset;
      bVar4 = false;
      do {
        bVar2 = ((FT_Frame_Field *)(pFVar12 + -1))->value;
        switch(bVar2) {
        case 4:
          FVar5 = FT_Stream_EnterFrame(stream,(ulong)*pFVar12);
          if (FVar5 != 0) goto LAB_001f09a8;
          bVar4 = true;
          puVar11 = (uint *)*ppuVar1;
          break;
        default:
          *ppuVar1 = (uchar *)__src;
          FVar5 = 0;
LAB_001f09a8:
          if (!bVar4) {
            return FVar5;
          }
          if (stream->read != (FT_Stream_IoFunc)0x0) {
            if (stream->base != (uchar *)0x0) {
              (*stream->memory->free)(stream->memory,stream->base);
            }
            stream->base = (uchar *)0x0;
          }
          *ppuVar1 = (uchar *)0x0;
          stream->limit = (uchar *)0x0;
          return FVar5;
        case 8:
        case 9:
          uVar10 = (ulong)(byte)*__src;
          puVar11 = (uint *)((long)__src + 1);
          sVar7 = 0x18;
          goto LAB_001f0919;
        case 0xc:
        case 0xd:
          uVar8 = (ushort)*__src << 8 | (ushort)*__src >> 8;
          goto LAB_001f08f0;
        case 0xe:
        case 0xf:
          uVar8 = (ushort)*__src;
LAB_001f08f0:
          uVar10 = (ulong)uVar8;
          puVar11 = (uint *)((long)__src + 2);
          sVar7 = 0x10;
LAB_001f0919:
          uVar6 = (long)(((int)uVar10 << sVar7) >> sVar7);
          if ((bVar2 & 1) == 0) {
            uVar6 = uVar10;
          }
          uVar10 = (ulong)*pFVar12;
          FVar3 = *(FT_Byte *)((long)pFVar12 + -1);
          if (FVar3 == '\x04') {
            *(int *)((long)structure + uVar10) = (int)uVar6;
          }
          else if (FVar3 == '\x02') {
            *(short *)((long)structure + uVar10) = (short)uVar6;
          }
          else if (FVar3 == '\x01') {
            *(char *)((long)structure + uVar10) = (char)uVar6;
          }
          else {
            *(ulong *)((long)structure + uVar10) = uVar6;
          }
          break;
        case 0x10:
        case 0x11:
          uVar9 = *__src;
          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          goto LAB_001f08a9;
        case 0x12:
        case 0x13:
          uVar9 = *__src;
LAB_001f08a9:
          uVar10 = (ulong)uVar9;
          puVar11 = __src + 1;
          sVar7 = 0;
          goto LAB_001f0919;
        case 0x14:
        case 0x15:
          uVar10 = (ulong)*(byte *)((long)__src + 2) |
                   (ulong)((uint)*(byte *)((long)__src + 1) << 8 | (uint)(byte)*__src << 0x10);
          goto LAB_001f0914;
        case 0x16:
        case 0x17:
          uVar10 = (ulong)(uint3)*__src;
LAB_001f0914:
          puVar11 = (uint *)((long)__src + 3);
          sVar7 = 8;
          goto LAB_001f0919;
        case 0x18:
        case 0x19:
          puVar11 = (uint *)((long)__src + (ulong)*(FT_Byte *)((long)pFVar12 + -1));
          if (stream->limit < puVar11) {
            FVar5 = 0x55;
            goto LAB_001f09a8;
          }
          if (bVar2 == 0x18) {
            memcpy((void *)((ulong)*pFVar12 + (long)structure),__src,
                   (ulong)*(FT_Byte *)((long)pFVar12 + -1));
          }
        }
        __src = puVar11;
        pFVar12 = pFVar12 + 2;
      } while( true );
    }
    FVar5 = 0x28;
  }
  return FVar5;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_ReadFields( FT_Stream              stream,
                        const FT_Frame_Field*  fields,
                        void*                  structure )
  {
    FT_Error  error;
    FT_Bool   frame_accessed = 0;
    FT_Byte*  cursor;


    if ( !fields )
      return FT_THROW( Invalid_Argument );

    if ( !stream )
      return FT_THROW( Invalid_Stream_Handle );

    cursor = stream->cursor;

    error = FT_Err_Ok;
    do
    {
      FT_ULong  value;
      FT_Int    sign_shift;
      FT_Byte*  p;


      switch ( fields->value )
      {
      case ft_frame_start:  /* access a new frame */
        error = FT_Stream_EnterFrame( stream, fields->offset );
        if ( error )
          goto Exit;

        frame_accessed = 1;
        cursor         = stream->cursor;
        fields++;
        continue;  /* loop! */

      case ft_frame_bytes:  /* read a byte sequence */
      case ft_frame_skip:   /* skip some bytes      */
        {
          FT_UInt  len = fields->size;


          if ( cursor + len > stream->limit )
          {
            error = FT_THROW( Invalid_Stream_Operation );
            goto Exit;
          }

          if ( fields->value == ft_frame_bytes )
          {
            p = (FT_Byte*)structure + fields->offset;
            FT_MEM_COPY( p, cursor, len );
          }
          cursor += len;
          fields++;
          continue;
        }

      case ft_frame_byte:
      case ft_frame_schar:  /* read a single byte */
        value = FT_NEXT_BYTE( cursor );
        sign_shift = 24;
        break;

      case ft_frame_short_be:
      case ft_frame_ushort_be:  /* read a 2-byte big-endian short */
        value = FT_NEXT_USHORT( cursor );
        sign_shift = 16;
        break;

      case ft_frame_short_le:
      case ft_frame_ushort_le:  /* read a 2-byte little-endian short */
        value = FT_NEXT_USHORT_LE( cursor );
        sign_shift = 16;
        break;

      case ft_frame_long_be:
      case ft_frame_ulong_be:  /* read a 4-byte big-endian long */
        value = FT_NEXT_ULONG( cursor );
        sign_shift = 0;
        break;

      case ft_frame_long_le:
      case ft_frame_ulong_le:  /* read a 4-byte little-endian long */
        value = FT_NEXT_ULONG_LE( cursor );
        sign_shift = 0;
        break;

      case ft_frame_off3_be:
      case ft_frame_uoff3_be:  /* read a 3-byte big-endian long */
        value = FT_NEXT_UOFF3( cursor );
        sign_shift = 8;
        break;

      case ft_frame_off3_le:
      case ft_frame_uoff3_le:  /* read a 3-byte little-endian long */
        value = FT_NEXT_UOFF3_LE( cursor );
        sign_shift = 8;
        break;

      default:
        /* otherwise, exit the loop */
        stream->cursor = cursor;
        goto Exit;
      }

      /* now, compute the signed value is necessary */
      if ( fields->value & FT_FRAME_OP_SIGNED )
        value = (FT_ULong)( (FT_Int32)( value << sign_shift ) >> sign_shift );

      /* finally, store the value in the object */

      p = (FT_Byte*)structure + fields->offset;
      switch ( fields->size )
      {
      case ( 8 / FT_CHAR_BIT ):
        *(FT_Byte*)p = (FT_Byte)value;
        break;

      case ( 16 / FT_CHAR_BIT ):
        *(FT_UShort*)p = (FT_UShort)value;
        break;

      case ( 32 / FT_CHAR_BIT ):
        *(FT_UInt32*)p = (FT_UInt32)value;
        break;

      default:  /* for 64-bit systems */
        *(FT_ULong*)p = (FT_ULong)value;
      }

      /* go to next field */
      fields++;
    }
    while ( 1 );

  Exit:
    /* close the frame if it was opened by this read */
    if ( frame_accessed )
      FT_Stream_ExitFrame( stream );

    return error;
  }